

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfScanLineInputFile.cpp
# Opt level: O0

void __thiscall
Imf_3_3::anon_unknown_11::ScanLineProcess::run_fill
          (ScanLineProcess *this,FrameBuffer *outfb,int fbY,
          vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *filllist)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  reference pSVar7;
  char *text;
  int in_EDX;
  long in_RDI;
  float fillVal_2;
  half fillVal_1;
  uint fillVal;
  int ex;
  int sx;
  uint8_t *outptr;
  int start;
  int stop;
  uint8_t *ptr;
  Slice *s;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *__range1;
  vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_> *in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  PixelType in_stack_ffffffffffffff74;
  undefined2 local_66;
  int local_5c;
  float *local_58;
  int local_50;
  float *local_48;
  __normal_iterator<const_Imf_3_3::Slice_*,_std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>_>
  local_30 [3];
  int local_14;
  
  local_14 = in_EDX;
  local_30[0]._M_current =
       (Slice *)std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>::begin
                          (in_stack_ffffffffffffff68);
  std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>::end(in_stack_ffffffffffffff68);
  do {
    bVar6 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Imf_3_3::Slice_*,_std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>_>
                        *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       (__normal_iterator<const_Imf_3_3::Slice_*,_std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>_>
                        *)in_stack_ffffffffffffff68);
    if (!bVar6) {
      return;
    }
    pSVar7 = __gnu_cxx::
             __normal_iterator<const_Imf_3_3::Slice_*,_std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>_>
             ::operator*(local_30);
    local_48 = (float *)(pSVar7->base +
                        (long)(local_14 / pSVar7->ySampling) * pSVar7->yStride +
                        (long)(*(int *)(in_RDI + 0xc) / pSVar7->xSampling) * pSVar7->xStride);
    iVar1 = *(int *)(in_RDI + 0x10);
    iVar2 = *(int *)(in_RDI + 0x14);
    iVar3 = *(int *)(in_RDI + 0xac);
    for (local_50 = local_14; local_50 < (iVar1 + iVar2) - iVar3; local_50 = local_50 + 1) {
      if (local_50 % pSVar7->ySampling == 0) {
        local_58 = local_48;
        iVar4 = *(int *)(in_RDI + 0xc);
        iVar5 = *(int *)(in_RDI + 0x18);
        for (local_5c = *(int *)(in_RDI + 0xc); local_5c < iVar4 + iVar5; local_5c = local_5c + 1) {
          if (local_5c % pSVar7->xSampling == 0) {
            in_stack_ffffffffffffff74 = pSVar7->type;
            if (in_stack_ffffffffffffff74 == UINT) {
              *local_58 = (float)(long)pSVar7->fillValue;
            }
            else if (in_stack_ffffffffffffff74 == HALF) {
              Imath_3_1::half::half
                        ((half *)CONCAT44(1,in_stack_ffffffffffffff70),
                         (float)((ulong)in_stack_ffffffffffffff68 >> 0x20));
              *(undefined2 *)local_58 = local_66;
            }
            else {
              if (in_stack_ffffffffffffff74 != FLOAT) {
                text = (char *)__cxa_allocate_exception(0x48);
                Iex_3_3::ArgExc::ArgExc
                          ((ArgExc *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                           text);
                __cxa_throw(text,&Iex_3_3::ArgExc::typeinfo,Iex_3_3::ArgExc::~ArgExc);
              }
              *local_58 = (float)pSVar7->fillValue;
            }
            local_58 = (float *)(pSVar7->xStride + (long)local_58);
          }
        }
        local_48 = (float *)(pSVar7->yStride + (long)local_48);
      }
    }
    __gnu_cxx::
    __normal_iterator<const_Imf_3_3::Slice_*,_std::vector<Imf_3_3::Slice,_std::allocator<Imf_3_3::Slice>_>_>
    ::operator++(local_30);
  } while( true );
}

Assistant:

void ScanLineProcess::run_fill (
    const FrameBuffer *outfb,
    int fbY,
    const std::vector<Slice> &filllist)
{
    for (auto& s: filllist)
    {
        uint8_t*       ptr;

        ptr  = reinterpret_cast<uint8_t*> (s.base);
        ptr += int64_t (cinfo.start_x / s.xSampling) * int64_t (s.xStride);
        ptr += int64_t (fbY / s.ySampling) * int64_t (s.yStride);

        // TODO: update ImfMisc, lift fill type / value
        int stop = cinfo.start_y + cinfo.height - decoder.user_line_end_ignore;
        for ( int start = fbY; start < stop; ++start )
        {
            if (start % s.ySampling) continue;

            uint8_t* outptr = ptr;
            for ( int sx = cinfo.start_x, ex = cinfo.start_x + cinfo.width;
                  sx < ex; ++sx )
            {
                if (sx % s.xSampling) continue;

                switch (s.type)
                {
                    case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:
                    {
                        unsigned int fillVal = (unsigned int) (s.fillValue);
                        *(unsigned int*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:
                    {
                        half fillVal = half (s.fillValue);
                        *(half*)outptr = fillVal;
                        break;
                    }

                    case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:
                    {
                        float fillVal = float (s.fillValue);
                        *(float*)outptr = fillVal;
                        break;
                    }
                    default:
                        throw IEX_NAMESPACE::ArgExc ("Unknown pixel data type.");
                }
                outptr += s.xStride;
            }

            ptr += s.yStride;
        }
    }
}